

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilzo.c
# Opt level: O3

lzo_uint32 lzo_adler32(lzo_uint32 adler,uchar *buf,lzo_uint len)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  
  if (buf == (uchar *)0x0) {
    return 1;
  }
  uVar1 = adler >> 0x10;
  uVar10 = adler & 0xffff;
  if (len != 0) {
    do {
      uVar2 = 0x15b0;
      if (len < 0x15b0) {
        uVar2 = len;
      }
      uVar12 = uVar2 & 0xffffffff;
      uVar11 = (uint)uVar2;
      if (len < 0x10) {
LAB_00121809:
        lVar21 = 0;
        do {
          uVar10 = uVar10 + buf[lVar21];
          uVar1 = uVar1 + uVar10;
          lVar21 = lVar21 + 1;
        } while (uVar11 != (uint)lVar21);
        buf = buf + (int)uVar11;
      }
      else {
        do {
          iVar13 = *buf + uVar10;
          iVar3 = (uint)buf[1] + iVar13;
          iVar14 = (uint)buf[2] + iVar3;
          iVar4 = (uint)buf[3] + iVar14;
          iVar15 = (uint)buf[4] + iVar4;
          iVar5 = (uint)buf[5] + iVar15;
          iVar16 = (uint)buf[6] + iVar5;
          iVar6 = (uint)buf[7] + iVar16;
          iVar17 = (uint)buf[8] + iVar6;
          iVar7 = (uint)buf[9] + iVar17;
          iVar18 = (uint)buf[10] + iVar7;
          iVar8 = (uint)buf[0xb] + iVar18;
          iVar19 = (uint)buf[0xc] + iVar8;
          iVar9 = (uint)buf[0xd] + iVar19;
          iVar20 = (uint)buf[0xe] + iVar9;
          uVar10 = (uint)buf[0xf] + iVar20;
          uVar1 = uVar1 + iVar13 + iVar3 + iVar14 + iVar4 + iVar15 + iVar5 + iVar16 + iVar6 + iVar17
                  + iVar7 + iVar18 + iVar8 + iVar19 + iVar9 + iVar20 + uVar10;
          buf = buf + 0x10;
          uVar11 = (int)uVar12 - 0x10;
          uVar12 = (ulong)uVar11;
        } while (0xf < uVar11);
        if (uVar11 != 0) goto LAB_00121809;
      }
      len = len - uVar2;
      uVar10 = uVar10 % 0xfff1;
      uVar1 = uVar1 % 0xfff1;
    } while (len != 0);
  }
  return uVar1 << 0x10 | uVar10;
}

Assistant:

LZO_PUBLIC(lzo_uint32)
lzo_adler32(lzo_uint32 adler, const lzo_bytep buf, lzo_uint len)
{
    lzo_uint32 s1 = adler & 0xffff;
    lzo_uint32 s2 = (adler >> 16) & 0xffff;
    unsigned k;

    if (buf == NULL)
        return 1;

    while (len > 0)
    {
        k = len < LZO_NMAX ? (unsigned) len : LZO_NMAX;
        len -= k;
        if (k >= 16) do
        {
            LZO_DO16(buf,0);
            buf += 16;
            k -= 16;
        } while (k >= 16);
        if (k != 0) do
        {
            s1 += *buf++;
            s2 += s1;
        } while (--k > 0);
        s1 %= LZO_BASE;
        s2 %= LZO_BASE;
    }
    return (s2 << 16) | s1;
}